

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O1

void __thiscall
cpptrace::system_error::system_error
          (system_error *this,int error_code,string *message_arg,raw_trace *trace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  error_category *peVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar2 = &local_90.field_2;
  pcVar3 = (message_arg->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + message_arg->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_90,": ");
  peVar5 = (error_category *)std::_V2::generic_category();
  (**(code **)(*(long *)peVar5 + 0x20))(&local_50,peVar5,error_code);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    uVar7 = local_90.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_50._M_string_length + local_90._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar7 = local_50.field_2._M_allocated_capacity;
    }
    if (local_50._M_string_length + local_90._M_string_length <= (ulong)uVar7) {
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_50,0,0,local_90._M_dataplus._M_p,local_90._M_string_length);
      goto LAB_00175af1;
    }
  }
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_90,local_50._M_dataplus._M_p,local_50._M_string_length);
LAB_00175af1:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if (paVar4 == paVar1) {
    local_70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_70._M_dataplus._M_p = (pointer)paVar4;
  }
  local_70._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  exception_with_message::exception_with_message((exception_with_message *)this,&local_70,trace);
  (this->super_runtime_error).super_exception_with_message.super_lazy_exception.super_exception =
       (exception)&PTR__exception_with_message_00227350;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  (this->super_runtime_error).super_exception_with_message.super_lazy_exception.super_exception =
       (exception)&PTR__exception_with_message_002271f8;
  (this->ec)._M_value = error_code;
  (this->ec)._M_cat = peVar5;
  return;
}

Assistant:

system_error::system_error(int error_code, std::string&& message_arg, raw_trace&& trace) noexcept
        : runtime_error(
            message_arg + ": " + std::error_code(error_code, std::generic_category()).message(),
            std::move(trace)
          ),
          ec(std::error_code(error_code, std::generic_category())) {}